

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.hh
# Opt level: O0

void __thiscall tchecker::system::loc_t::~loc_t(loc_t *this)

{
  loc_t *this_local;
  
  attributes_t::~attributes_t(&this->_attributes);
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

~loc_t() = default;